

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV1MaterialListBlock(Parser *this)

{
  pointer pMVar1;
  pointer pMVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  allocator<char> local_341;
  int local_340;
  uint iMaterialCount;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_338;
  string local_330;
  Material local_310;
  
  iMaterialCount = 0;
  local_338 = &this->m_vMaterials;
  pMVar1 = (this->m_vMaterials).
           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pMVar2 = (this->m_vMaterials).
           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar8 = 0;
  local_340 = 0;
LAB_003766a5:
  do {
    while( true ) {
      pbVar5 = (byte *)this->filePtr;
      bVar6 = *pbVar5;
      if (bVar6 != 0x2a) break;
      this->filePtr = (char *)(pbVar5 + 1);
      bVar3 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_COUNT",0xe);
      iVar7 = (int)(((long)pMVar1 - (long)pMVar2) / 0x2e0);
      if (bVar3) {
        ParseLV4MeshLong(this,&iMaterialCount);
        uVar8 = iMaterialCount;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"INVALID",&local_341);
        ASE::Material::Material(&local_310,&local_330);
        std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::resize
                  (local_338,(ulong)(uVar8 + iVar7),&local_310);
        ASE::Material::~Material(&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        goto LAB_003766a5;
      }
      bVar3 = TokenMatch<char_const>(&this->filePtr,"MATERIAL",8);
      if (!bVar3) {
        pbVar5 = (byte *)this->filePtr;
        bVar6 = *pbVar5;
        goto LAB_003767ba;
      }
      local_310.super_Material._vptr_Material._0_4_ = 0;
      ParseLV4MeshLong(this,(uint *)&local_310);
      uVar4 = (uint)local_310.super_Material._vptr_Material;
      if (uVar8 <= (uint)local_310.super_Material._vptr_Material) {
        LogWarning(this,"Out of range: material index is too large");
        uVar4 = uVar8 - 1;
      }
      ParseLV2MaterialBlock
                (this,(this->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start + (uVar4 + iVar7));
    }
    if (bVar6 == 0) {
      return;
    }
    if (bVar6 == 0x7b) {
      local_340 = local_340 + 1;
LAB_003767d7:
      bVar3 = false;
    }
    else {
      if (bVar6 == 0x7d) {
        local_340 = local_340 + -1;
        if (local_340 == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
        goto LAB_003767d7;
      }
LAB_003767ba:
      bVar3 = false;
      if ((bVar6 < 0xe) && ((0x3401U >> (bVar6 & 0x1f) & 1) != 0)) {
        if (this->bLastWasEndLine != false) goto LAB_003767d7;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
    }
    this->bLastWasEndLine = bVar3;
    this->filePtr = (char *)(pbVar5 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV1MaterialListBlock()
{
    AI_ASE_PARSER_INIT();

    unsigned int iMaterialCount = 0;
    unsigned int iOldMaterialCount = (unsigned int)m_vMaterials.size();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_COUNT",14))
            {
                ParseLV4MeshLong(iMaterialCount);

                // now allocate enough storage to hold all materials
                m_vMaterials.resize(iOldMaterialCount+iMaterialCount, Material("INVALID"));
                continue;
            }
            if (TokenMatch(filePtr,"MATERIAL",8))
            {
                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iMaterialCount)
                {
                    LogWarning("Out of range: material index is too large");
                    iIndex = iMaterialCount-1;
                }

                // get a reference to the material
                Material& sMat = m_vMaterials[iIndex+iOldMaterialCount];
                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}